

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to8.h
# Opt level: O0

void ncnn::im2col_sgemm_pack1to8_avx
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  int iVar36;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m256 _val;
  __m256 _w0_2;
  int j_2;
  __m256 _sum;
  int nn_2;
  float *kptr0_2;
  float *tmpptr_5;
  __m256 _val3_1;
  __m256 _val2_1;
  __m256 _val1_1;
  __m256 _val0_1;
  __m256 _w0_1;
  int j_1;
  __m256 _sum3_1;
  __m256 _sum2_1;
  __m256 _sum1_1;
  __m256 _sum0_1;
  int nn_1;
  float *kptr0_1;
  float *tmpptr_4;
  __m256 _val7;
  __m256 _val6;
  __m256 _val5;
  __m256 _val4;
  __m256 _val3;
  __m256 _val2;
  __m256 _val1;
  __m256 _val0;
  __m256 _w0;
  int j;
  __m256 _sum7;
  __m256 _sum6;
  __m256 _sum5;
  __m256 _sum4;
  __m256 _sum3;
  __m256 _sum2;
  __m256 _sum1;
  __m256 _sum0;
  int nn;
  float *kptr0;
  float *tmpptr_3;
  int i_3;
  float *biasptr;
  float zeros [8];
  float *outptr0;
  int p;
  int k_2;
  float *img0_2;
  int q_2;
  float *tmpptr_2;
  int i_2;
  __m128 _r0_1;
  int k_1;
  float *img0_1;
  int q_1;
  float *tmpptr_1;
  int i_1;
  int ii_1;
  __m256 _r0;
  int k;
  float *img0;
  int q;
  float *tmpptr;
  int i;
  int ii;
  int remain_size_start;
  int nn_size;
  Mat tmp;
  float *bias;
  int outch;
  int inch;
  int maxk;
  int size;
  Mat *m_11;
  Mat *m_9;
  Mat *m_7;
  Mat *m_6;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_12;
  Mat *m_10;
  Mat *m_8;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  undefined8 in_stack_ffffffffffffd4f8;
  undefined4 in_stack_ffffffffffffd500;
  undefined4 in_stack_ffffffffffffd504;
  int in_stack_ffffffffffffd50c;
  int in_stack_ffffffffffffd510;
  int in_stack_ffffffffffffd514;
  undefined4 in_stack_ffffffffffffd518;
  undefined4 in_stack_ffffffffffffd51c;
  Allocator *in_stack_ffffffffffffd578;
  undefined8 *local_2850;
  int local_2684;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2640;
  undefined8 local_2638;
  undefined8 local_2630;
  undefined4 local_2628;
  long local_2620;
  undefined4 local_2618;
  undefined4 local_2614;
  undefined4 local_2610;
  undefined4 local_260c;
  undefined4 local_2608;
  undefined8 local_2600;
  undefined8 *local_25f8;
  undefined8 local_25f0;
  undefined8 local_25e8;
  undefined8 local_25e0;
  undefined4 local_25d8;
  long *local_25d0;
  undefined4 local_25c8;
  undefined4 local_25c4;
  undefined4 local_25c0;
  undefined4 local_25bc;
  undefined4 local_25b8;
  undefined8 local_25b0;
  float *local_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  int local_24e4;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  int local_2444;
  undefined8 local_2440;
  undefined8 local_2438;
  undefined8 local_2430;
  undefined4 local_2428;
  long local_2420;
  undefined4 local_2418;
  undefined4 local_2414;
  undefined4 local_2410;
  undefined4 local_240c;
  undefined4 local_2408;
  undefined8 local_2400;
  undefined8 *local_23f8;
  undefined8 local_23f0;
  undefined8 local_23e8;
  undefined8 local_23e0;
  undefined4 local_23d8;
  long *local_23d0;
  undefined4 local_23c8;
  undefined4 local_23c4;
  undefined4 local_23c0;
  undefined4 local_23bc;
  undefined4 local_23b8;
  undefined8 local_23b0;
  float *local_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  int local_2264;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  int local_2154;
  undefined8 local_2150;
  undefined8 local_2148;
  undefined8 local_2140;
  undefined4 local_2138;
  long local_2130;
  undefined4 local_2128;
  undefined4 local_2124;
  undefined4 local_2120;
  undefined4 local_211c;
  undefined4 local_2118;
  undefined8 local_2110;
  undefined8 *local_2108;
  undefined8 local_2100;
  undefined8 local_20f8;
  undefined8 local_20f0;
  undefined4 local_20e8;
  long *local_20e0;
  undefined4 local_20d8;
  undefined4 local_20d4;
  undefined4 local_20d0;
  undefined4 local_20cc;
  undefined4 local_20c8;
  undefined8 local_20c0;
  float *local_20b8;
  int local_20ac;
  undefined8 *local_20a8;
  undefined8 local_20a0 [5];
  undefined8 local_2078;
  undefined8 local_2070;
  undefined8 local_2068;
  undefined4 local_2060;
  long local_2058;
  undefined4 local_2050;
  undefined4 local_204c;
  undefined4 local_2048;
  undefined4 local_2044;
  undefined4 local_2040;
  undefined8 local_2038;
  undefined1 (*local_2030) [32];
  int local_2028;
  int local_2024;
  undefined8 local_2020;
  undefined8 local_2018;
  undefined8 local_2010;
  undefined4 local_2008;
  long local_2000;
  undefined4 local_1ff8;
  undefined4 local_1ff4;
  undefined4 local_1ff0;
  undefined4 local_1fec;
  undefined4 local_1fe8;
  undefined8 local_1fe0;
  undefined4 *local_1fd8;
  int local_1fcc;
  undefined8 local_1fc8;
  undefined8 local_1fc0;
  undefined8 local_1fb8;
  undefined4 local_1fb0;
  long *local_1fa8;
  undefined4 local_1fa0;
  undefined4 local_1f9c;
  undefined4 local_1f98;
  undefined4 local_1f94;
  undefined4 local_1f90;
  undefined8 local_1f88;
  undefined4 *local_1f80;
  int local_1f74;
  undefined8 local_1f70;
  undefined8 uStack_1f68;
  int local_1f54;
  undefined8 local_1f50;
  undefined8 local_1f48;
  undefined8 local_1f40;
  undefined4 local_1f38;
  long local_1f30;
  undefined4 local_1f28;
  undefined4 local_1f24;
  undefined4 local_1f20;
  undefined4 local_1f1c;
  undefined4 local_1f18;
  undefined8 local_1f10;
  undefined1 (*local_1f08) [16];
  int local_1efc;
  undefined8 local_1ef8;
  undefined8 local_1ef0;
  undefined8 local_1ee8;
  undefined4 local_1ee0;
  long *local_1ed8;
  undefined4 local_1ed0;
  undefined4 local_1ecc;
  undefined4 local_1ec8;
  undefined4 local_1ec4;
  undefined4 local_1ec0;
  undefined8 local_1eb8;
  undefined1 (*local_1eb0) [16];
  int local_1ea8;
  int local_1ea4;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  int local_1e7c;
  undefined8 local_1e78;
  undefined8 local_1e70;
  undefined8 local_1e68;
  undefined4 local_1e60;
  long local_1e58;
  undefined4 local_1e50;
  undefined4 local_1e4c;
  undefined4 local_1e48;
  undefined4 local_1e44;
  undefined4 local_1e40;
  undefined8 local_1e38;
  undefined1 (*local_1e30) [32];
  int local_1e24;
  undefined8 local_1e20;
  undefined8 local_1e18;
  undefined8 local_1e10;
  undefined4 local_1e08;
  long *local_1e00;
  undefined4 local_1df8;
  undefined4 local_1df4;
  undefined4 local_1df0;
  undefined4 local_1dec;
  undefined4 local_1de8;
  undefined8 local_1de0;
  undefined1 (*local_1dd8) [32];
  int local_1dcc;
  int local_1dc8;
  int local_1dc4;
  int local_1dc0;
  void *local_1db0;
  int *local_1da8;
  long local_1da0;
  undefined4 local_1d98;
  long *local_1d90;
  undefined4 local_1d88;
  int local_1d84;
  int local_1d80;
  undefined4 local_1d7c;
  undefined4 local_1d78;
  long local_1d70;
  long local_1d68;
  int local_1d60;
  int local_1d5c;
  int local_1d58;
  int local_1d54;
  long *local_1d40;
  long *local_1d38;
  long *local_1d30;
  void **local_1d28;
  undefined8 *local_1d20;
  undefined8 *local_1d10;
  undefined8 *local_1d00;
  undefined8 *local_1cf0;
  undefined8 *local_1ce0;
  undefined8 *local_1cd0;
  undefined8 *local_1cc0;
  undefined8 *local_1cb0;
  undefined8 *local_1ca0;
  undefined8 *local_1c90;
  undefined8 *local_1c80;
  undefined8 *local_1c70;
  undefined8 *local_1c60;
  void **local_1c50;
  int local_1c30;
  undefined4 local_1c2c;
  void **local_1c28;
  undefined8 *local_1c08;
  undefined8 *local_1be8;
  undefined8 *local_1bc8;
  undefined8 *local_1ba8;
  undefined8 *local_1b88;
  undefined8 *local_1b68;
  undefined8 *local_1b48;
  undefined8 *local_1b28;
  undefined8 *local_1b08;
  undefined8 *local_1ae8;
  undefined8 *local_1ac8;
  undefined8 *local_1aa8;
  undefined8 *local_1a88;
  undefined1 local_1a7d;
  int local_1a7c;
  void **local_1a78;
  undefined8 *local_1a70;
  undefined1 local_1a4d;
  int local_1a4c;
  void **local_1a48;
  undefined8 *local_1a40;
  undefined1 local_1a1d;
  int local_1a1c;
  void **local_1a18;
  undefined8 *local_1a10;
  undefined1 local_19ed;
  int local_19ec;
  undefined8 *local_19e0;
  undefined1 local_19bd;
  int local_19bc;
  void **local_19b8;
  undefined8 *local_19b0;
  undefined1 local_198d;
  int local_198c;
  void **local_1988;
  undefined8 *local_1980;
  undefined1 local_195d;
  int local_195c;
  void **local_1958;
  undefined8 *local_1950;
  undefined8 *local_1930;
  undefined8 *local_1928;
  undefined8 *local_1920;
  undefined8 *local_1918;
  undefined8 *local_1910;
  undefined8 *local_1908;
  undefined8 *local_1900;
  undefined8 *local_18f8;
  undefined8 *local_18f0;
  undefined8 *local_18e8;
  undefined1 local_18d5;
  int local_18d4;
  undefined8 *local_18c8;
  undefined1 local_18a5;
  int local_18a4;
  undefined8 *local_1898;
  undefined1 local_1875;
  int local_1874;
  undefined8 *local_1868;
  undefined1 local_1845;
  int local_1844;
  undefined8 *local_1838;
  undefined1 local_1815;
  int local_1814;
  undefined8 *local_1808;
  undefined1 local_17e5;
  int local_17e4;
  undefined8 *local_17d8;
  undefined8 *local_17b8;
  undefined8 *local_17b0;
  undefined8 *local_17a8;
  void *local_1668;
  undefined8 *local_1658;
  undefined8 *local_1650;
  undefined8 *local_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined1 (*local_1608) [32];
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined1 (*local_15c8) [32];
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined1 (*local_1588) [32];
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined1 (*local_1548) [32];
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined1 (*local_1508) [32];
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined1 (*local_14c8) [32];
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined1 (*local_1488) [32];
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined1 (*local_1448) [32];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 (*local_1408) [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 (*local_13c8) [32];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined1 (*local_1388) [32];
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined1 (*local_1348) [32];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 (*local_1308) [32];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined1 (*local_12c8) [32];
  undefined8 *local_12c0;
  undefined8 *local_12b8;
  undefined8 *local_12b0;
  undefined1 (*local_12a8) [32];
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_126c;
  float *local_1268;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float local_122c;
  float *local_1228;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  float local_11ec;
  float *local_11e8;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  float local_11ac;
  float *local_11a8;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  float local_116c;
  float *local_1168;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  float local_112c;
  float *local_1128;
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  float local_10ec;
  float *local_10e8;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  float local_10ac;
  float *local_10a8;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  float fStack_1084;
  float local_106c;
  float *local_1068;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  float local_102c;
  float *local_1028;
  float local_1020;
  float fStack_101c;
  float fStack_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  float fStack_1004;
  float local_fec;
  float *local_fe8;
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  float fStack_fc4;
  float local_fac;
  float *local_fa8;
  float local_fa0;
  float fStack_f9c;
  float fStack_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float fStack_f88;
  float fStack_f84;
  float local_f6c;
  float *local_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 (*local_3f8) [16];
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined1 (*local_3e0) [16];
  long local_3d8;
  undefined4 local_3cc;
  long local_3c8;
  long local_3c0;
  undefined4 local_3b4;
  int local_3b0;
  int local_3ac;
  undefined8 *local_3a8;
  long local_3a0;
  undefined4 local_394;
  long local_390;
  long local_388;
  undefined4 local_37c;
  int local_378;
  int local_374;
  undefined8 *local_370;
  long local_368;
  undefined4 local_35c;
  long local_358;
  long local_350;
  undefined4 local_344;
  int local_340;
  int local_33c;
  undefined8 *local_338;
  long local_330;
  undefined4 local_324;
  long local_320;
  undefined8 *local_318;
  undefined4 local_30c;
  int local_308;
  int local_304;
  undefined8 *local_300;
  long local_2f8;
  undefined4 local_2ec;
  long local_2e8;
  undefined8 *local_2e0;
  undefined4 local_2d4;
  int local_2d0;
  int local_2cc;
  undefined8 *local_2c8;
  long local_2c0;
  undefined4 local_2b4;
  long local_2b0;
  undefined8 *local_2a8;
  undefined4 local_29c;
  int local_298;
  int local_294;
  undefined8 *local_290;
  long *local_288;
  undefined4 local_27c;
  long local_278;
  undefined1 (*local_270) [32];
  undefined4 local_264;
  int local_260;
  int local_25c;
  undefined8 *local_258;
  long *local_250;
  undefined4 local_244;
  long local_240;
  undefined1 (*local_238) [16];
  undefined4 local_22c;
  int local_228;
  int local_224;
  undefined8 *local_220;
  long *local_218;
  undefined4 local_20c;
  long local_208;
  undefined4 *local_200;
  undefined4 local_1f4;
  int local_1f0;
  int local_1ec;
  undefined8 *local_1e8;
  long local_1e0;
  undefined4 local_1d4;
  long local_1d0;
  undefined1 (*local_1c8) [32];
  undefined4 local_1bc;
  int local_1b8;
  int local_1b4;
  undefined8 *local_1b0;
  long *local_1a8;
  undefined4 local_19c;
  long local_198;
  float *local_190;
  undefined4 local_184;
  int local_180;
  int local_17c;
  undefined8 *local_178;
  long *local_170;
  undefined4 local_164;
  long local_160;
  float *local_158;
  undefined4 local_14c;
  int local_148;
  int local_144;
  undefined8 *local_140;
  long *local_138;
  undefined4 local_12c;
  long local_128;
  float *local_120;
  undefined4 local_114;
  int local_110;
  int local_10c;
  undefined8 *local_108;
  undefined4 local_fc;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  
  local_1d54 = *(int *)((long)in_RDI + 0x2c);
  local_1d58 = (int)in_RDI[6];
  local_1d5c = (int)in_RDI[7];
  local_1d60 = (int)in_RSI[7];
  local_1d68 = *in_RCX;
  local_1d28 = &local_1db0;
  local_1db0 = (void *)0x0;
  local_1da8 = (int *)0x0;
  local_1da0 = 0;
  local_1d98 = 0;
  local_1d90 = (long *)0x0;
  local_1d88 = 0;
  local_1d84 = 0;
  local_1d80 = 0;
  local_1d7c = 0;
  local_1d78 = 0;
  local_1d70 = 0;
  iVar36 = (int)((ulong)in_stack_ffffffffffffd4f8 >> 0x20);
  local_1d40 = in_RDX;
  local_1d38 = in_RSI;
  local_1d30 = in_RDI;
  if (local_1d54 < 8) {
    if (local_1d54 < 4) {
      Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffd51c,in_stack_ffffffffffffd518),
                  in_stack_ffffffffffffd514,in_stack_ffffffffffffd510,in_stack_ffffffffffffd50c,
                  CONCAT44(in_stack_ffffffffffffd504,in_stack_ffffffffffffd500),iVar36,
                  in_stack_ffffffffffffd578);
    }
    else {
      Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffd51c,in_stack_ffffffffffffd518),
                  in_stack_ffffffffffffd514,in_stack_ffffffffffffd510,in_stack_ffffffffffffd50c,
                  CONCAT44(in_stack_ffffffffffffd504,in_stack_ffffffffffffd500),iVar36,
                  in_stack_ffffffffffffd578);
    }
  }
  else {
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffd51c,in_stack_ffffffffffffd518),
                in_stack_ffffffffffffd514,in_stack_ffffffffffffd510,in_stack_ffffffffffffd50c,
                CONCAT44(in_stack_ffffffffffffd504,in_stack_ffffffffffffd500),iVar36,
                in_stack_ffffffffffffd578);
  }
  iVar36 = local_1d54 >> 3;
  for (local_1dc8 = 0; local_1dc8 < iVar36; local_1dc8 = local_1dc8 + 1) {
    local_1dcc = local_1dc8 * 8;
    local_195c = local_1dcc / 8;
    local_1950 = &local_1e20;
    local_1958 = &local_1db0;
    local_270 = (undefined1 (*) [32])((long)local_1db0 + local_1d70 * local_195c * local_1da0);
    local_258 = &local_1e20;
    local_98 = (long)local_1d84 * (long)local_1d80 * local_1da0;
    local_1918 = &local_1e20;
    local_1d20 = &local_1e20;
    local_1e00 = local_1d90;
    local_9c = 0x10;
    local_25c = local_1d84;
    local_260 = local_1d80;
    local_264 = local_1d7c;
    local_278 = local_1da0;
    local_27c = local_1d98;
    local_288 = local_1d90;
    local_195d = 1;
    local_1e20 = 0;
    local_1e10 = 0;
    local_1e08 = 0;
    local_1df8 = 0;
    local_1df4 = 0;
    local_1df0 = 0;
    local_1dec = 0;
    local_1de8 = 0;
    local_1de0 = 0;
    local_1e18 = 0;
    local_1dd8 = local_270;
    for (local_1e24 = 0; local_1e24 < local_1d5c; local_1e24 = local_1e24 + 1) {
      local_17d8 = &local_1e78;
      local_3ac = *(int *)((long)local_1d30 + 0x2c);
      local_3b0 = (int)local_1d30[6];
      local_3b4 = *(undefined4 *)((long)local_1d30 + 0x34);
      local_3c0 = *local_1d30 + local_1d30[8] * (long)local_1e24 * local_1d30[2];
      local_3c8 = local_1d30[2];
      local_3cc = (undefined4)local_1d30[3];
      local_3d8 = local_1d30[4];
      local_3a8 = &local_1e78;
      local_38 = (long)local_3ac * (long)local_3b0 * local_3c8;
      local_18e8 = &local_1e78;
      local_1e30 = (undefined1 (*) [32])(local_3c0 + (long)local_1dcc * 4);
      local_1d10 = &local_1e78;
      local_3c = 0x10;
      local_17e4 = local_1e24;
      local_17e5 = 1;
      local_1e78 = 0;
      local_1e68 = 0;
      local_1e60 = 0;
      local_1e50 = 0;
      local_1e4c = 0;
      local_1e48 = 0;
      local_1e44 = 0;
      local_1e40 = 0;
      local_1e38 = 0;
      local_1e70 = 0;
      for (local_1e7c = 0; local_1e7c < local_1d58; local_1e7c = local_1e7c + 1) {
        local_12a8 = local_1e30;
        local_1ea0 = *(undefined8 *)*local_1e30;
        uStack_1e98 = *(undefined8 *)(*local_1e30 + 8);
        uStack_1e90 = *(undefined8 *)(*local_1e30 + 0x10);
        uStack_1e88 = *(undefined8 *)(*local_1e30 + 0x18);
        local_12c8 = local_1dd8;
        *local_1dd8 = *local_1e30;
        local_1e30 = (undefined1 (*) [32])(*local_1e30 + (long)local_1d54 * 4);
        local_1dd8 = local_1dd8 + 1;
        local_1300 = local_1ea0;
        uStack_12f8 = uStack_1e98;
        uStack_12f0 = uStack_1e90;
        uStack_12e8 = uStack_1e88;
      }
      local_1aa8 = local_1d10;
      local_1e58 = local_3d8;
    }
    local_1a88 = local_1d20;
  }
  local_1dc0 = local_1d54 + iVar36 * -8 >> 2;
  for (local_1ea4 = 0; local_1ea4 < local_1dc0; local_1ea4 = local_1ea4 + 1) {
    local_1ea8 = iVar36 * 8 + local_1ea4 * 4;
    local_198c = local_1ea8 / 8 +
                 (int)((long)((ulong)(uint)((int)((long)local_1ea8 % 8) >> 0x1f) << 0x20 |
                             (long)local_1ea8 % 8 & 0xffffffffU) / 4);
    local_1980 = &local_1ef8;
    local_1988 = &local_1db0;
    local_238 = (undefined1 (*) [16])((long)local_1db0 + local_1d70 * local_198c * local_1da0);
    local_220 = &local_1ef8;
    local_a8 = (long)local_1d84 * (long)local_1d80 * local_1da0;
    local_1920 = &local_1ef8;
    local_1d00 = &local_1ef8;
    local_1ed8 = local_1d90;
    local_ac = 0x10;
    local_224 = local_1d84;
    local_228 = local_1d80;
    local_22c = local_1d7c;
    local_240 = local_1da0;
    local_244 = local_1d98;
    local_250 = local_1d90;
    local_198d = 1;
    local_1ef8 = 0;
    local_1ee8 = 0;
    local_1ee0 = 0;
    local_1ed0 = 0;
    local_1ecc = 0;
    local_1ec8 = 0;
    local_1ec4 = 0;
    local_1ec0 = 0;
    local_1eb8 = 0;
    local_1ef0 = 0;
    local_1eb0 = local_238;
    for (local_1efc = 0; local_1efc < local_1d5c; local_1efc = local_1efc + 1) {
      local_1808 = &local_1f50;
      local_374 = *(int *)((long)local_1d30 + 0x2c);
      local_378 = (int)local_1d30[6];
      local_37c = *(undefined4 *)((long)local_1d30 + 0x34);
      local_388 = *local_1d30 + local_1d30[8] * (long)local_1efc * local_1d30[2];
      local_390 = local_1d30[2];
      local_394 = (undefined4)local_1d30[3];
      local_3a0 = local_1d30[4];
      local_370 = &local_1f50;
      local_48 = (long)local_374 * (long)local_378 * local_390;
      local_18f0 = &local_1f50;
      local_1f08 = (undefined1 (*) [16])(local_388 + (long)local_1ea8 * 4);
      local_1cf0 = &local_1f50;
      local_4c = 0x10;
      local_1814 = local_1efc;
      local_1815 = 1;
      local_1f50 = 0;
      local_1f40 = 0;
      local_1f38 = 0;
      local_1f28 = 0;
      local_1f24 = 0;
      local_1f20 = 0;
      local_1f1c = 0;
      local_1f18 = 0;
      local_1f10 = 0;
      local_1f48 = 0;
      for (local_1f54 = 0; local_1f54 < local_1d58; local_1f54 = local_1f54 + 1) {
        local_3f8 = local_1f08;
        local_1f70 = *(undefined8 *)*local_1f08;
        uStack_1f68 = *(undefined8 *)(*local_1f08 + 8);
        local_3e0 = local_1eb0;
        *local_1eb0 = *local_1f08;
        local_1f08 = (undefined1 (*) [16])(*local_1f08 + (long)local_1d54 * 4);
        local_1eb0 = local_1eb0 + 1;
        local_3f0 = local_1f70;
        uStack_3e8 = uStack_1f68;
      }
      local_1ae8 = local_1cf0;
      local_1f30 = local_3a0;
    }
    local_1ac8 = local_1d00;
  }
  local_1dc4 = local_1dc0 * 4 + iVar36 * 8;
  for (local_1f74 = local_1dc4; local_1f74 < local_1d54; local_1f74 = local_1f74 + 1) {
    local_19bc = local_1f74 / 8 +
                 (int)((long)((ulong)(uint)((int)((long)local_1f74 % 8) >> 0x1f) << 0x20 |
                             (long)local_1f74 % 8 & 0xffffffffU) / 4) + local_1f74 % 4;
    local_19b0 = &local_1fc8;
    local_19b8 = &local_1db0;
    local_200 = (undefined4 *)((long)local_1db0 + local_1d70 * local_19bc * local_1da0);
    local_1e8 = &local_1fc8;
    local_b8 = (long)local_1d84 * (long)local_1d80 * local_1da0;
    local_1928 = &local_1fc8;
    local_1ce0 = &local_1fc8;
    local_1fa8 = local_1d90;
    local_bc = 0x10;
    local_1ec = local_1d84;
    local_1f0 = local_1d80;
    local_1f4 = local_1d7c;
    local_208 = local_1da0;
    local_20c = local_1d98;
    local_218 = local_1d90;
    local_19bd = 1;
    local_1fc8 = 0;
    local_1fb8 = 0;
    local_1fb0 = 0;
    local_1fa0 = 0;
    local_1f9c = 0;
    local_1f98 = 0;
    local_1f94 = 0;
    local_1f90 = 0;
    local_1f88 = 0;
    local_1fc0 = 0;
    local_1f80 = local_200;
    for (local_1fcc = 0; local_1fcc < local_1d5c; local_1fcc = local_1fcc + 1) {
      local_1838 = &local_2020;
      local_33c = *(int *)((long)local_1d30 + 0x2c);
      local_340 = (int)local_1d30[6];
      local_344 = *(undefined4 *)((long)local_1d30 + 0x34);
      local_350 = *local_1d30 + local_1d30[8] * (long)local_1fcc * local_1d30[2];
      local_358 = local_1d30[2];
      local_35c = (undefined4)local_1d30[3];
      local_368 = local_1d30[4];
      local_338 = &local_2020;
      local_58 = (long)local_33c * (long)local_340 * local_358;
      local_18f8 = &local_2020;
      local_1fd8 = (undefined4 *)(local_350 + (long)local_1f74 * 4);
      local_1cd0 = &local_2020;
      local_5c = 0x10;
      local_1844 = local_1fcc;
      local_1845 = 1;
      local_2020 = 0;
      local_2010 = 0;
      local_2008 = 0;
      local_1ff8 = 0;
      local_1ff4 = 0;
      local_1ff0 = 0;
      local_1fec = 0;
      local_1fe8 = 0;
      local_1fe0 = 0;
      local_2018 = 0;
      for (local_2024 = 0; local_2024 < local_1d58; local_2024 = local_2024 + 1) {
        *local_1f80 = *local_1fd8;
        local_1fd8 = local_1fd8 + local_1d54;
        local_1f80 = local_1f80 + 1;
      }
      local_1b28 = local_1cd0;
      local_2000 = local_368;
    }
    local_1b08 = local_1ce0;
  }
  for (local_2028 = 0; local_2028 < local_1d60; local_2028 = local_2028 + 1) {
    local_19e0 = &local_2078;
    local_1b4 = *(int *)((long)local_1d38 + 0x2c);
    local_1b8 = (int)local_1d38[6];
    local_1bc = *(undefined4 *)((long)local_1d38 + 0x34);
    local_2030 = (undefined1 (*) [32])
                 (*local_1d38 + local_1d38[8] * (long)local_2028 * local_1d38[2]);
    local_1d0 = local_1d38[2];
    local_1d4 = (undefined4)local_1d38[3];
    local_1e0 = local_1d38[4];
    local_1b0 = &local_2078;
    local_c8 = (long)local_1b4 * (long)local_1b8 * local_1d0;
    local_1930 = &local_2078;
    local_1cc0 = &local_2078;
    local_cc = 0x10;
    local_19ec = local_2028;
    local_19ed = 1;
    local_2078 = 0;
    local_2068 = 0;
    local_2060 = 0;
    local_2050 = 0;
    local_204c = 0;
    local_2048 = 0;
    local_2044 = 0;
    local_2040 = 0;
    local_2038 = 0;
    local_2070 = 0;
    local_1b48 = local_1cc0;
    local_1c8 = local_2030;
    local_2058 = local_1e0;
    memset(local_20a0,0,0x20);
    if (local_1d68 == 0) {
      local_2850 = local_20a0;
    }
    else {
      local_2850 = (undefined8 *)(local_1d68 + (long)(local_2028 << 3) * 4);
    }
    local_20a8 = local_2850;
    for (local_20ac = 0; local_20ac + 7 < local_1d54; local_20ac = local_20ac + 8) {
      local_1a1c = local_20ac / 8;
      local_1a10 = &local_2100;
      local_1a18 = &local_1db0;
      local_190 = (float *)((long)local_1db0 + local_1d70 * local_1a1c * local_1da0);
      local_178 = &local_2100;
      local_d8 = (long)local_1d84 * (long)local_1d80 * local_1da0;
      local_17a8 = &local_2100;
      local_1cb0 = &local_2100;
      local_20e0 = local_1d90;
      local_dc = 0x10;
      local_17c = local_1d84;
      local_180 = local_1d80;
      local_184 = local_1d7c;
      local_198 = local_1da0;
      local_19c = local_1d98;
      local_1a8 = local_1d90;
      local_1a1d = 1;
      local_2100 = 0;
      local_20f0 = 0;
      local_20e8 = 0;
      local_20d4 = 0;
      local_20d0 = 0;
      local_20cc = 0;
      local_20c8 = 0;
      local_20f8 = 0;
      local_1868 = &local_2150;
      local_304 = *(int *)((long)local_1d40 + 0x2c);
      local_308 = (int)local_1d40[6];
      local_30c = *(undefined4 *)((long)local_1d40 + 0x34);
      local_318 = (undefined8 *)(*local_1d40 + local_1d40[8] * (long)local_2028 * local_1d40[2]);
      local_320 = local_1d40[2];
      local_324 = (undefined4)local_1d40[3];
      local_330 = local_1d40[4];
      local_300 = &local_2150;
      local_68 = (long)local_304 * (long)local_308 * local_320;
      local_6c = 0x10;
      local_1874 = local_2028;
      local_1875 = 1;
      local_20c0 = 0;
      local_20d8 = 0;
      local_1900 = &local_2150;
      local_1ca0 = &local_2150;
      local_2150 = 0;
      local_2140 = 0;
      local_2138 = 0;
      local_2128 = 0;
      local_2124 = 0;
      local_2120 = 0;
      local_211c = 0;
      local_2118 = 0;
      local_2110 = 0;
      local_2148 = 0;
      local_2154 = local_1d5c * local_1d58;
      local_12b0 = local_2850;
      local_2260 = *local_2850;
      uStack_2258 = local_2850[1];
      uStack_2250 = local_2850[2];
      uStack_2248 = local_2850[3];
      local_2240 = local_2260;
      uStack_2238 = uStack_2258;
      uStack_2230 = uStack_2250;
      uStack_2228 = uStack_2248;
      local_2220 = local_2260;
      uStack_2218 = uStack_2258;
      uStack_2210 = uStack_2250;
      uStack_2208 = uStack_2248;
      local_2200 = local_2260;
      uStack_21f8 = uStack_2258;
      uStack_21f0 = uStack_2250;
      uStack_21e8 = uStack_2248;
      local_21e0 = local_2260;
      uStack_21d8 = uStack_2258;
      uStack_21d0 = uStack_2250;
      uStack_21c8 = uStack_2248;
      local_21c0 = local_2260;
      uStack_21b8 = uStack_2258;
      uStack_21b0 = uStack_2250;
      uStack_21a8 = uStack_2248;
      local_21a0 = local_2260;
      uStack_2198 = uStack_2258;
      uStack_2190 = uStack_2250;
      uStack_2188 = uStack_2248;
      local_2180 = local_2260;
      uStack_2178 = uStack_2258;
      uStack_2170 = uStack_2250;
      uStack_2168 = uStack_2248;
      local_2108 = local_318;
      local_20b8 = local_190;
      for (local_2264 = 0; local_2264 < local_2154; local_2264 = local_2264 + 1) {
        local_1648 = local_2108;
        local_22a0 = *local_2108;
        uStack_2298 = local_2108[1];
        uStack_2290 = local_2108[2];
        uStack_2288 = local_2108[3];
        local_f68 = local_20b8;
        local_fa0 = *local_20b8;
        local_22c0 = CONCAT44(local_fa0,local_fa0);
        uStack_22b8 = CONCAT44(local_fa0,local_fa0);
        uStack_22b0 = CONCAT44(local_fa0,local_fa0);
        uStack_22a8 = CONCAT44(local_fa0,local_fa0);
        local_fa8 = local_20b8 + 1;
        local_fe0 = *local_fa8;
        local_22e0 = CONCAT44(local_fe0,local_fe0);
        uStack_22d8 = CONCAT44(local_fe0,local_fe0);
        uStack_22d0 = CONCAT44(local_fe0,local_fe0);
        uStack_22c8 = CONCAT44(local_fe0,local_fe0);
        local_ae0 = local_2180;
        uStack_ad8 = uStack_2178;
        uStack_ad0 = uStack_2170;
        uStack_ac8 = uStack_2168;
        local_740._0_4_ = (float)local_22a0;
        local_740._4_4_ = (float)((ulong)local_22a0 >> 0x20);
        uStack_738._0_4_ = (float)uStack_2298;
        uStack_738._4_4_ = (float)((ulong)uStack_2298 >> 0x20);
        uStack_730._0_4_ = (float)uStack_2290;
        uStack_730._4_4_ = (float)((ulong)uStack_2290 >> 0x20);
        uStack_728._0_4_ = (float)uStack_2288;
        local_a60 = local_fa0 * (float)local_740;
        fStack_a5c = local_fa0 * local_740._4_4_;
        fStack_a58 = local_fa0 * (float)uStack_738;
        fStack_a54 = local_fa0 * uStack_738._4_4_;
        fStack_a50 = local_fa0 * (float)uStack_730;
        fStack_a4c = local_fa0 * uStack_730._4_4_;
        fStack_a48 = local_fa0 * (float)uStack_728;
        uVar1 = local_2180;
        uVar2 = uStack_2178;
        uVar3 = uStack_2170;
        uVar4 = uStack_2168;
        local_a80._0_4_ = (float)local_2180;
        local_a80._4_4_ = (float)((ulong)local_2180 >> 0x20);
        uStack_a78._0_4_ = (float)uStack_2178;
        uStack_a78._4_4_ = (float)((ulong)uStack_2178 >> 0x20);
        uStack_a70._0_4_ = (float)uStack_2170;
        uStack_a70._4_4_ = (float)((ulong)uStack_2170 >> 0x20);
        uStack_a68._0_4_ = (float)uStack_2168;
        uStack_a68._4_4_ = (float)((ulong)uStack_2168 >> 0x20);
        local_2180 = CONCAT44(fStack_a5c + local_a80._4_4_,local_a60 + (float)local_a80);
        uStack_2178 = CONCAT44(fStack_a54 + uStack_a78._4_4_,fStack_a58 + (float)uStack_a78);
        uStack_2170 = CONCAT44(fStack_a4c + uStack_a70._4_4_,fStack_a50 + (float)uStack_a70);
        uStack_2168 = CONCAT44(local_fa0 + uStack_a68._4_4_,fStack_a48 + (float)uStack_a68);
        local_b40 = local_21a0;
        uStack_b38 = uStack_2198;
        uStack_b30 = uStack_2190;
        uStack_b28 = uStack_2188;
        local_a20 = local_fe0 * (float)local_740;
        fStack_a1c = local_fe0 * local_740._4_4_;
        fStack_a18 = local_fe0 * (float)uStack_738;
        fStack_a14 = local_fe0 * uStack_738._4_4_;
        fStack_a10 = local_fe0 * (float)uStack_730;
        fStack_a0c = local_fe0 * uStack_730._4_4_;
        fStack_a08 = local_fe0 * (float)uStack_728;
        uVar5 = local_21a0;
        uVar6 = uStack_2198;
        uVar7 = uStack_2190;
        uVar8 = uStack_2188;
        local_a40._0_4_ = (float)local_21a0;
        local_a40._4_4_ = (float)((ulong)local_21a0 >> 0x20);
        uStack_a38._0_4_ = (float)uStack_2198;
        uStack_a38._4_4_ = (float)((ulong)uStack_2198 >> 0x20);
        uStack_a30._0_4_ = (float)uStack_2190;
        uStack_a30._4_4_ = (float)((ulong)uStack_2190 >> 0x20);
        uStack_a28._0_4_ = (float)uStack_2188;
        uStack_a28._4_4_ = (float)((ulong)uStack_2188 >> 0x20);
        local_21a0 = CONCAT44(fStack_a1c + local_a40._4_4_,local_a20 + (float)local_a40);
        uStack_2198 = CONCAT44(fStack_a14 + uStack_a38._4_4_,fStack_a18 + (float)uStack_a38);
        uStack_2190 = CONCAT44(fStack_a0c + uStack_a30._4_4_,fStack_a10 + (float)uStack_a30);
        uStack_2188 = CONCAT44(local_fe0 + uStack_a28._4_4_,fStack_a08 + (float)uStack_a28);
        local_fe8 = local_20b8 + 2;
        local_1020 = *local_fe8;
        local_2300 = CONCAT44(local_1020,local_1020);
        uStack_22f8 = CONCAT44(local_1020,local_1020);
        uStack_22f0 = CONCAT44(local_1020,local_1020);
        uStack_22e8 = CONCAT44(local_1020,local_1020);
        local_1028 = local_20b8 + 3;
        local_1060 = *local_1028;
        local_2320 = CONCAT44(local_1060,local_1060);
        uStack_2318 = CONCAT44(local_1060,local_1060);
        uStack_2310 = CONCAT44(local_1060,local_1060);
        uStack_2308 = CONCAT44(local_1060,local_1060);
        local_ba0 = local_21c0;
        uStack_b98 = uStack_21b8;
        uStack_b90 = uStack_21b0;
        uStack_b88 = uStack_21a8;
        local_9e0 = local_1020 * (float)local_740;
        fStack_9dc = local_1020 * local_740._4_4_;
        fStack_9d8 = local_1020 * (float)uStack_738;
        fStack_9d4 = local_1020 * uStack_738._4_4_;
        fStack_9d0 = local_1020 * (float)uStack_730;
        fStack_9cc = local_1020 * uStack_730._4_4_;
        fStack_9c8 = local_1020 * (float)uStack_728;
        uVar9 = local_21c0;
        uVar10 = uStack_21b8;
        uVar11 = uStack_21b0;
        uVar12 = uStack_21a8;
        local_a00._0_4_ = (float)local_21c0;
        local_a00._4_4_ = (float)((ulong)local_21c0 >> 0x20);
        uStack_9f8._0_4_ = (float)uStack_21b8;
        uStack_9f8._4_4_ = (float)((ulong)uStack_21b8 >> 0x20);
        uStack_9f0._0_4_ = (float)uStack_21b0;
        uStack_9f0._4_4_ = (float)((ulong)uStack_21b0 >> 0x20);
        uStack_9e8._0_4_ = (float)uStack_21a8;
        uStack_9e8._4_4_ = (float)((ulong)uStack_21a8 >> 0x20);
        local_21c0 = CONCAT44(fStack_9dc + local_a00._4_4_,local_9e0 + (float)local_a00);
        uStack_21b8 = CONCAT44(fStack_9d4 + uStack_9f8._4_4_,fStack_9d8 + (float)uStack_9f8);
        uStack_21b0 = CONCAT44(fStack_9cc + uStack_9f0._4_4_,fStack_9d0 + (float)uStack_9f0);
        uStack_21a8 = CONCAT44(local_1020 + uStack_9e8._4_4_,fStack_9c8 + (float)uStack_9e8);
        local_c00 = local_21e0;
        uStack_bf8 = uStack_21d8;
        uStack_bf0 = uStack_21d0;
        uStack_be8 = uStack_21c8;
        local_9a0 = local_1060 * (float)local_740;
        fStack_99c = local_1060 * local_740._4_4_;
        fStack_998 = local_1060 * (float)uStack_738;
        fStack_994 = local_1060 * uStack_738._4_4_;
        fStack_990 = local_1060 * (float)uStack_730;
        fStack_98c = local_1060 * uStack_730._4_4_;
        fStack_988 = local_1060 * (float)uStack_728;
        uVar13 = local_21e0;
        uVar14 = uStack_21d8;
        uVar15 = uStack_21d0;
        uVar16 = uStack_21c8;
        local_9c0._0_4_ = (float)local_21e0;
        local_9c0._4_4_ = (float)((ulong)local_21e0 >> 0x20);
        uStack_9b8._0_4_ = (float)uStack_21d8;
        uStack_9b8._4_4_ = (float)((ulong)uStack_21d8 >> 0x20);
        uStack_9b0._0_4_ = (float)uStack_21d0;
        uStack_9b0._4_4_ = (float)((ulong)uStack_21d0 >> 0x20);
        uStack_9a8._0_4_ = (float)uStack_21c8;
        uStack_9a8._4_4_ = (float)((ulong)uStack_21c8 >> 0x20);
        local_21e0 = CONCAT44(fStack_99c + local_9c0._4_4_,local_9a0 + (float)local_9c0);
        uStack_21d8 = CONCAT44(fStack_994 + uStack_9b8._4_4_,fStack_998 + (float)uStack_9b8);
        uStack_21d0 = CONCAT44(fStack_98c + uStack_9b0._4_4_,fStack_990 + (float)uStack_9b0);
        uStack_21c8 = CONCAT44(local_1060 + uStack_9a8._4_4_,fStack_988 + (float)uStack_9a8);
        local_1068 = local_20b8 + 4;
        local_10a0 = *local_1068;
        local_2340 = CONCAT44(local_10a0,local_10a0);
        uStack_2338 = CONCAT44(local_10a0,local_10a0);
        uStack_2330 = CONCAT44(local_10a0,local_10a0);
        uStack_2328 = CONCAT44(local_10a0,local_10a0);
        local_10a8 = local_20b8 + 5;
        local_10e0 = *local_10a8;
        local_2360 = CONCAT44(local_10e0,local_10e0);
        uStack_2358 = CONCAT44(local_10e0,local_10e0);
        uStack_2350 = CONCAT44(local_10e0,local_10e0);
        uStack_2348 = CONCAT44(local_10e0,local_10e0);
        local_c60 = local_2200;
        uStack_c58 = uStack_21f8;
        uStack_c50 = uStack_21f0;
        uStack_c48 = uStack_21e8;
        local_960 = local_10a0 * (float)local_740;
        fStack_95c = local_10a0 * local_740._4_4_;
        fStack_958 = local_10a0 * (float)uStack_738;
        fStack_954 = local_10a0 * uStack_738._4_4_;
        fStack_950 = local_10a0 * (float)uStack_730;
        fStack_94c = local_10a0 * uStack_730._4_4_;
        fStack_948 = local_10a0 * (float)uStack_728;
        uVar17 = local_2200;
        uVar18 = uStack_21f8;
        uVar19 = uStack_21f0;
        uVar20 = uStack_21e8;
        local_980._0_4_ = (float)local_2200;
        local_980._4_4_ = (float)((ulong)local_2200 >> 0x20);
        uStack_978._0_4_ = (float)uStack_21f8;
        uStack_978._4_4_ = (float)((ulong)uStack_21f8 >> 0x20);
        uStack_970._0_4_ = (float)uStack_21f0;
        uStack_970._4_4_ = (float)((ulong)uStack_21f0 >> 0x20);
        uStack_968._0_4_ = (float)uStack_21e8;
        uStack_968._4_4_ = (float)((ulong)uStack_21e8 >> 0x20);
        local_2200 = CONCAT44(fStack_95c + local_980._4_4_,local_960 + (float)local_980);
        uStack_21f8 = CONCAT44(fStack_954 + uStack_978._4_4_,fStack_958 + (float)uStack_978);
        uStack_21f0 = CONCAT44(fStack_94c + uStack_970._4_4_,fStack_950 + (float)uStack_970);
        uStack_21e8 = CONCAT44(local_10a0 + uStack_968._4_4_,fStack_948 + (float)uStack_968);
        local_cc0 = local_2220;
        uStack_cb8 = uStack_2218;
        uStack_cb0 = uStack_2210;
        uStack_ca8 = uStack_2208;
        local_920 = local_10e0 * (float)local_740;
        fStack_91c = local_10e0 * local_740._4_4_;
        fStack_918 = local_10e0 * (float)uStack_738;
        fStack_914 = local_10e0 * uStack_738._4_4_;
        fStack_910 = local_10e0 * (float)uStack_730;
        fStack_90c = local_10e0 * uStack_730._4_4_;
        fStack_908 = local_10e0 * (float)uStack_728;
        uVar21 = local_2220;
        uVar22 = uStack_2218;
        uVar23 = uStack_2210;
        uVar24 = uStack_2208;
        local_940._0_4_ = (float)local_2220;
        local_940._4_4_ = (float)((ulong)local_2220 >> 0x20);
        uStack_938._0_4_ = (float)uStack_2218;
        uStack_938._4_4_ = (float)((ulong)uStack_2218 >> 0x20);
        uStack_930._0_4_ = (float)uStack_2210;
        uStack_930._4_4_ = (float)((ulong)uStack_2210 >> 0x20);
        uStack_928._0_4_ = (float)uStack_2208;
        uStack_928._4_4_ = (float)((ulong)uStack_2208 >> 0x20);
        local_2220 = CONCAT44(fStack_91c + local_940._4_4_,local_920 + (float)local_940);
        uStack_2218 = CONCAT44(fStack_914 + uStack_938._4_4_,fStack_918 + (float)uStack_938);
        uStack_2210 = CONCAT44(fStack_90c + uStack_930._4_4_,fStack_910 + (float)uStack_930);
        uStack_2208 = CONCAT44(local_10e0 + uStack_928._4_4_,fStack_908 + (float)uStack_928);
        local_10e8 = local_20b8 + 6;
        local_1120 = *local_10e8;
        local_2380 = CONCAT44(local_1120,local_1120);
        uStack_2378 = CONCAT44(local_1120,local_1120);
        uStack_2370 = CONCAT44(local_1120,local_1120);
        uStack_2368 = CONCAT44(local_1120,local_1120);
        local_1128 = local_20b8 + 7;
        local_1160 = *local_1128;
        local_23a0 = CONCAT44(local_1160,local_1160);
        uStack_2398 = CONCAT44(local_1160,local_1160);
        uStack_2390 = CONCAT44(local_1160,local_1160);
        uStack_2388 = CONCAT44(local_1160,local_1160);
        local_d20 = local_2240;
        uStack_d18 = uStack_2238;
        uStack_d10 = uStack_2230;
        uStack_d08 = uStack_2228;
        local_8e0 = local_1120 * (float)local_740;
        fStack_8dc = local_1120 * local_740._4_4_;
        fStack_8d8 = local_1120 * (float)uStack_738;
        fStack_8d4 = local_1120 * uStack_738._4_4_;
        fStack_8d0 = local_1120 * (float)uStack_730;
        fStack_8cc = local_1120 * uStack_730._4_4_;
        fStack_8c8 = local_1120 * (float)uStack_728;
        uVar25 = local_2240;
        uVar26 = uStack_2238;
        uVar27 = uStack_2230;
        uVar28 = uStack_2228;
        local_900._0_4_ = (float)local_2240;
        local_900._4_4_ = (float)((ulong)local_2240 >> 0x20);
        uStack_8f8._0_4_ = (float)uStack_2238;
        uStack_8f8._4_4_ = (float)((ulong)uStack_2238 >> 0x20);
        uStack_8f0._0_4_ = (float)uStack_2230;
        uStack_8f0._4_4_ = (float)((ulong)uStack_2230 >> 0x20);
        uStack_8e8._0_4_ = (float)uStack_2228;
        uStack_8e8._4_4_ = (float)((ulong)uStack_2228 >> 0x20);
        local_2240 = CONCAT44(fStack_8dc + local_900._4_4_,local_8e0 + (float)local_900);
        uStack_2238 = CONCAT44(fStack_8d4 + uStack_8f8._4_4_,fStack_8d8 + (float)uStack_8f8);
        uStack_2230 = CONCAT44(fStack_8cc + uStack_8f0._4_4_,fStack_8d0 + (float)uStack_8f0);
        uStack_2228 = CONCAT44(local_1120 + uStack_8e8._4_4_,fStack_8c8 + (float)uStack_8e8);
        local_d80 = local_2260;
        uStack_d78 = uStack_2258;
        uStack_d70 = uStack_2250;
        uStack_d68 = uStack_2248;
        local_8a0 = local_1160 * (float)local_740;
        fStack_89c = local_1160 * local_740._4_4_;
        fStack_898 = local_1160 * (float)uStack_738;
        fStack_894 = local_1160 * uStack_738._4_4_;
        fStack_890 = local_1160 * (float)uStack_730;
        fStack_88c = local_1160 * uStack_730._4_4_;
        fStack_888 = local_1160 * (float)uStack_728;
        uVar29 = local_2260;
        uVar30 = uStack_2258;
        uVar31 = uStack_2250;
        uVar32 = uStack_2248;
        local_8c0._0_4_ = (float)local_2260;
        local_8c0._4_4_ = (float)((ulong)local_2260 >> 0x20);
        uStack_8b8._0_4_ = (float)uStack_2258;
        uStack_8b8._4_4_ = (float)((ulong)uStack_2258 >> 0x20);
        uStack_8b0._0_4_ = (float)uStack_2250;
        uStack_8b0._4_4_ = (float)((ulong)uStack_2250 >> 0x20);
        uStack_8a8._0_4_ = (float)uStack_2248;
        uStack_8a8._4_4_ = (float)((ulong)uStack_2248 >> 0x20);
        local_2260 = CONCAT44(fStack_89c + local_8c0._4_4_,local_8a0 + (float)local_8c0);
        uStack_2258 = CONCAT44(fStack_894 + uStack_8b8._4_4_,fStack_898 + (float)uStack_8b8);
        uStack_2250 = CONCAT44(fStack_88c + uStack_8b0._4_4_,fStack_890 + (float)uStack_8b0);
        uStack_2248 = CONCAT44(local_1160 + uStack_8a8._4_4_,fStack_888 + (float)uStack_8a8);
        local_20b8 = local_20b8 + 8;
        local_2108 = local_2108 + 4;
        fStack_115c = local_1160;
        fStack_1158 = local_1160;
        fStack_1154 = local_1160;
        fStack_1150 = local_1160;
        fStack_114c = local_1160;
        fStack_1148 = local_1160;
        fStack_1144 = local_1160;
        local_112c = local_1160;
        fStack_111c = local_1120;
        fStack_1118 = local_1120;
        fStack_1114 = local_1120;
        fStack_1110 = local_1120;
        fStack_110c = local_1120;
        fStack_1108 = local_1120;
        fStack_1104 = local_1120;
        local_10ec = local_1120;
        fStack_10dc = local_10e0;
        fStack_10d8 = local_10e0;
        fStack_10d4 = local_10e0;
        fStack_10d0 = local_10e0;
        fStack_10cc = local_10e0;
        fStack_10c8 = local_10e0;
        fStack_10c4 = local_10e0;
        local_10ac = local_10e0;
        fStack_109c = local_10a0;
        fStack_1098 = local_10a0;
        fStack_1094 = local_10a0;
        fStack_1090 = local_10a0;
        fStack_108c = local_10a0;
        fStack_1088 = local_10a0;
        fStack_1084 = local_10a0;
        local_106c = local_10a0;
        fStack_105c = local_1060;
        fStack_1058 = local_1060;
        fStack_1054 = local_1060;
        fStack_1050 = local_1060;
        fStack_104c = local_1060;
        fStack_1048 = local_1060;
        fStack_1044 = local_1060;
        local_102c = local_1060;
        fStack_101c = local_1020;
        fStack_1018 = local_1020;
        fStack_1014 = local_1020;
        fStack_1010 = local_1020;
        fStack_100c = local_1020;
        fStack_1008 = local_1020;
        fStack_1004 = local_1020;
        local_fec = local_1020;
        fStack_fdc = local_fe0;
        fStack_fd8 = local_fe0;
        fStack_fd4 = local_fe0;
        fStack_fd0 = local_fe0;
        fStack_fcc = local_fe0;
        fStack_fc8 = local_fe0;
        fStack_fc4 = local_fe0;
        local_fac = local_fe0;
        fStack_f9c = local_fa0;
        fStack_f98 = local_fa0;
        fStack_f94 = local_fa0;
        fStack_f90 = local_fa0;
        fStack_f8c = local_fa0;
        fStack_f88 = local_fa0;
        fStack_f84 = local_fa0;
        local_f6c = local_fa0;
        local_d60 = local_22a0;
        uStack_d58 = uStack_2298;
        uStack_d50 = uStack_2290;
        uStack_d48 = uStack_2288;
        local_d40 = local_23a0;
        uStack_d38 = uStack_2398;
        uStack_d30 = uStack_2390;
        uStack_d28 = uStack_2388;
        local_d00 = local_22a0;
        uStack_cf8 = uStack_2298;
        uStack_cf0 = uStack_2290;
        uStack_ce8 = uStack_2288;
        local_ce0 = local_2380;
        uStack_cd8 = uStack_2378;
        uStack_cd0 = uStack_2370;
        uStack_cc8 = uStack_2368;
        local_ca0 = local_22a0;
        uStack_c98 = uStack_2298;
        uStack_c90 = uStack_2290;
        uStack_c88 = uStack_2288;
        local_c80 = local_2360;
        uStack_c78 = uStack_2358;
        uStack_c70 = uStack_2350;
        uStack_c68 = uStack_2348;
        local_c40 = local_22a0;
        uStack_c38 = uStack_2298;
        uStack_c30 = uStack_2290;
        uStack_c28 = uStack_2288;
        local_c20 = local_2340;
        uStack_c18 = uStack_2338;
        uStack_c10 = uStack_2330;
        uStack_c08 = uStack_2328;
        local_be0 = local_22a0;
        uStack_bd8 = uStack_2298;
        uStack_bd0 = uStack_2290;
        uStack_bc8 = uStack_2288;
        local_bc0 = local_2320;
        uStack_bb8 = uStack_2318;
        uStack_bb0 = uStack_2310;
        uStack_ba8 = uStack_2308;
        local_b80 = local_22a0;
        uStack_b78 = uStack_2298;
        uStack_b70 = uStack_2290;
        uStack_b68 = uStack_2288;
        local_b60 = local_2300;
        uStack_b58 = uStack_22f8;
        uStack_b50 = uStack_22f0;
        uStack_b48 = uStack_22e8;
        local_b20 = local_22a0;
        uStack_b18 = uStack_2298;
        uStack_b10 = uStack_2290;
        uStack_b08 = uStack_2288;
        local_b00 = local_22e0;
        uStack_af8 = uStack_22d8;
        uStack_af0 = uStack_22d0;
        uStack_ae8 = uStack_22c8;
        local_ac0 = local_22a0;
        uStack_ab8 = uStack_2298;
        uStack_ab0 = uStack_2290;
        uStack_aa8 = uStack_2288;
        local_aa0 = local_22c0;
        uStack_a98 = uStack_22b8;
        uStack_a90 = uStack_22b0;
        uStack_a88 = uStack_22a8;
        local_a80 = uVar1;
        uStack_a78 = uVar2;
        uStack_a70 = uVar3;
        uStack_a68 = uVar4;
        fStack_a44 = local_fa0;
        local_a40 = uVar5;
        uStack_a38 = uVar6;
        uStack_a30 = uVar7;
        uStack_a28 = uVar8;
        fStack_a04 = local_fe0;
        local_a00 = uVar9;
        uStack_9f8 = uVar10;
        uStack_9f0 = uVar11;
        uStack_9e8 = uVar12;
        fStack_9c4 = local_1020;
        local_9c0 = uVar13;
        uStack_9b8 = uVar14;
        uStack_9b0 = uVar15;
        uStack_9a8 = uVar16;
        fStack_984 = local_1060;
        local_980 = uVar17;
        uStack_978 = uVar18;
        uStack_970 = uVar19;
        uStack_968 = uVar20;
        fStack_944 = local_10a0;
        local_940 = uVar21;
        uStack_938 = uVar22;
        uStack_930 = uVar23;
        uStack_928 = uVar24;
        fStack_904 = local_10e0;
        local_900 = uVar25;
        uStack_8f8 = uVar26;
        uStack_8f0 = uVar27;
        uStack_8e8 = uVar28;
        fStack_8c4 = local_1120;
        local_8c0 = uVar29;
        uStack_8b8 = uVar30;
        uStack_8b0 = uVar31;
        uStack_8a8 = uVar32;
        fStack_884 = local_1160;
        local_740 = local_22a0;
        uStack_738 = uStack_2298;
        uStack_730 = uStack_2290;
        uStack_728 = uStack_2288;
        local_720 = local_fa0;
        fStack_71c = local_fa0;
        fStack_718 = local_fa0;
        fStack_714 = local_fa0;
        fStack_710 = local_fa0;
        fStack_70c = local_fa0;
        fStack_708 = local_fa0;
        fStack_704 = local_fa0;
        local_700 = local_22a0;
        uStack_6f8 = uStack_2298;
        uStack_6f0 = uStack_2290;
        uStack_6e8 = uStack_2288;
        local_6e0 = local_fe0;
        fStack_6dc = local_fe0;
        fStack_6d8 = local_fe0;
        fStack_6d4 = local_fe0;
        fStack_6d0 = local_fe0;
        fStack_6cc = local_fe0;
        fStack_6c8 = local_fe0;
        fStack_6c4 = local_fe0;
        local_6c0 = local_22a0;
        uStack_6b8 = uStack_2298;
        uStack_6b0 = uStack_2290;
        uStack_6a8 = uStack_2288;
        local_6a0 = local_1020;
        fStack_69c = local_1020;
        fStack_698 = local_1020;
        fStack_694 = local_1020;
        fStack_690 = local_1020;
        fStack_68c = local_1020;
        fStack_688 = local_1020;
        fStack_684 = local_1020;
        local_680 = local_22a0;
        uStack_678 = uStack_2298;
        uStack_670 = uStack_2290;
        uStack_668 = uStack_2288;
        local_660 = local_1060;
        fStack_65c = local_1060;
        fStack_658 = local_1060;
        fStack_654 = local_1060;
        fStack_650 = local_1060;
        fStack_64c = local_1060;
        fStack_648 = local_1060;
        fStack_644 = local_1060;
        local_640 = local_22a0;
        uStack_638 = uStack_2298;
        uStack_630 = uStack_2290;
        uStack_628 = uStack_2288;
        local_620 = local_10a0;
        fStack_61c = local_10a0;
        fStack_618 = local_10a0;
        fStack_614 = local_10a0;
        fStack_610 = local_10a0;
        fStack_60c = local_10a0;
        fStack_608 = local_10a0;
        fStack_604 = local_10a0;
        local_600 = local_22a0;
        uStack_5f8 = uStack_2298;
        uStack_5f0 = uStack_2290;
        uStack_5e8 = uStack_2288;
        local_5e0 = local_10e0;
        fStack_5dc = local_10e0;
        fStack_5d8 = local_10e0;
        fStack_5d4 = local_10e0;
        fStack_5d0 = local_10e0;
        fStack_5cc = local_10e0;
        fStack_5c8 = local_10e0;
        fStack_5c4 = local_10e0;
        local_5c0 = local_22a0;
        uStack_5b8 = uStack_2298;
        uStack_5b0 = uStack_2290;
        uStack_5a8 = uStack_2288;
        local_5a0 = local_1120;
        fStack_59c = local_1120;
        fStack_598 = local_1120;
        fStack_594 = local_1120;
        fStack_590 = local_1120;
        fStack_58c = local_1120;
        fStack_588 = local_1120;
        fStack_584 = local_1120;
        local_580 = local_22a0;
        uStack_578 = uStack_2298;
        uStack_570 = uStack_2290;
        uStack_568 = uStack_2288;
        local_560 = local_1160;
        fStack_55c = local_1160;
        fStack_558 = local_1160;
        fStack_554 = local_1160;
        fStack_550 = local_1160;
        fStack_54c = local_1160;
        fStack_548 = local_1160;
        fStack_544 = local_1160;
      }
      local_1308 = local_2030;
      local_1340 = local_2180;
      uStack_1338 = uStack_2178;
      uStack_1330 = uStack_2170;
      uStack_1328 = uStack_2168;
      *(undefined8 *)*local_2030 = local_2180;
      *(undefined8 *)(*local_2030 + 8) = uStack_2178;
      *(undefined8 *)(*local_2030 + 0x10) = uStack_2170;
      *(undefined8 *)(*local_2030 + 0x18) = uStack_2168;
      local_1348 = local_2030 + 1;
      local_1380 = local_21a0;
      uStack_1378 = uStack_2198;
      uStack_1370 = uStack_2190;
      uStack_1368 = uStack_2188;
      *(undefined8 *)*local_1348 = local_21a0;
      *(undefined8 *)(local_2030[1] + 8) = uStack_2198;
      *(undefined8 *)(local_2030[1] + 0x10) = uStack_2190;
      *(undefined8 *)(local_2030[1] + 0x18) = uStack_2188;
      local_1388 = local_2030 + 2;
      local_13c0 = local_21c0;
      uStack_13b8 = uStack_21b8;
      uStack_13b0 = uStack_21b0;
      uStack_13a8 = uStack_21a8;
      *(undefined8 *)*local_1388 = local_21c0;
      *(undefined8 *)(local_2030[2] + 8) = uStack_21b8;
      *(undefined8 *)(local_2030[2] + 0x10) = uStack_21b0;
      *(undefined8 *)(local_2030[2] + 0x18) = uStack_21a8;
      local_13c8 = local_2030 + 3;
      local_1400 = local_21e0;
      uStack_13f8 = uStack_21d8;
      uStack_13f0 = uStack_21d0;
      uStack_13e8 = uStack_21c8;
      *(undefined8 *)*local_13c8 = local_21e0;
      *(undefined8 *)(local_2030[3] + 8) = uStack_21d8;
      *(undefined8 *)(local_2030[3] + 0x10) = uStack_21d0;
      *(undefined8 *)(local_2030[3] + 0x18) = uStack_21c8;
      local_1408 = local_2030 + 4;
      local_1440 = local_2200;
      uStack_1438 = uStack_21f8;
      uStack_1430 = uStack_21f0;
      uStack_1428 = uStack_21e8;
      *(undefined8 *)*local_1408 = local_2200;
      *(undefined8 *)(local_2030[4] + 8) = uStack_21f8;
      *(undefined8 *)(local_2030[4] + 0x10) = uStack_21f0;
      *(undefined8 *)(local_2030[4] + 0x18) = uStack_21e8;
      local_1448 = local_2030 + 5;
      local_1480 = local_2220;
      uStack_1478 = uStack_2218;
      uStack_1470 = uStack_2210;
      uStack_1468 = uStack_2208;
      *(undefined8 *)*local_1448 = local_2220;
      *(undefined8 *)(local_2030[5] + 8) = uStack_2218;
      *(undefined8 *)(local_2030[5] + 0x10) = uStack_2210;
      *(undefined8 *)(local_2030[5] + 0x18) = uStack_2208;
      local_1488 = local_2030 + 6;
      local_14c0 = local_2240;
      uStack_14b8 = uStack_2238;
      uStack_14b0 = uStack_2230;
      uStack_14a8 = uStack_2228;
      *(undefined8 *)*local_1488 = local_2240;
      *(undefined8 *)(local_2030[6] + 8) = uStack_2238;
      *(undefined8 *)(local_2030[6] + 0x10) = uStack_2230;
      *(undefined8 *)(local_2030[6] + 0x18) = uStack_2228;
      local_14c8 = local_2030 + 7;
      local_1500 = local_2260;
      uStack_14f8 = uStack_2258;
      uStack_14f0 = uStack_2250;
      uStack_14e8 = uStack_2248;
      auVar35._8_8_ = uStack_2258;
      auVar35._0_8_ = local_2260;
      auVar35._16_8_ = uStack_2250;
      auVar35._24_8_ = uStack_2248;
      *local_14c8 = auVar35;
      local_2030 = local_2030 + 8;
      local_1b88 = local_1ca0;
      local_1b68 = local_1cb0;
      local_2130 = local_330;
    }
    for (; local_20ac + 3 < local_1d54; local_20ac = local_20ac + 4) {
      local_1a4c = local_20ac / 8 +
                   (int)((long)((ulong)(uint)((int)((long)local_20ac % 8) >> 0x1f) << 0x20 |
                               (long)local_20ac % 8 & 0xffffffffU) / 4);
      local_1a40 = &local_23f0;
      local_1a48 = &local_1db0;
      local_158 = (float *)((long)local_1db0 + local_1d70 * local_1a4c * local_1da0);
      local_140 = &local_23f0;
      local_e8 = (long)local_1d84 * (long)local_1d80 * local_1da0;
      local_17b0 = &local_23f0;
      local_1c90 = &local_23f0;
      local_23d0 = local_1d90;
      local_ec = 0x10;
      local_144 = local_1d84;
      local_148 = local_1d80;
      local_14c = local_1d7c;
      local_160 = local_1da0;
      local_164 = local_1d98;
      local_170 = local_1d90;
      local_1a4d = 1;
      local_23f0 = 0;
      local_23e0 = 0;
      local_23d8 = 0;
      local_23c4 = 0;
      local_23c0 = 0;
      local_23bc = 0;
      local_23b8 = 0;
      local_23e8 = 0;
      local_1898 = &local_2440;
      local_2cc = *(int *)((long)local_1d40 + 0x2c);
      local_2d0 = (int)local_1d40[6];
      local_2d4 = *(undefined4 *)((long)local_1d40 + 0x34);
      local_2e0 = (undefined8 *)(*local_1d40 + local_1d40[8] * (long)local_2028 * local_1d40[2]);
      local_2e8 = local_1d40[2];
      local_2ec = (undefined4)local_1d40[3];
      local_2f8 = local_1d40[4];
      local_2c8 = &local_2440;
      local_78 = (long)local_2cc * (long)local_2d0 * local_2e8;
      local_7c = 0x10;
      local_18a4 = local_2028;
      local_18a5 = 1;
      local_23b0 = 0;
      local_23c8 = 0;
      local_1908 = &local_2440;
      local_1c80 = &local_2440;
      local_2440 = 0;
      local_2430 = 0;
      local_2428 = 0;
      local_2418 = 0;
      local_2414 = 0;
      local_2410 = 0;
      local_240c = 0;
      local_2408 = 0;
      local_2400 = 0;
      local_2438 = 0;
      local_2444 = local_1d5c * local_1d58;
      local_12b8 = local_2850;
      local_24e0 = *local_2850;
      uStack_24d8 = local_2850[1];
      uStack_24d0 = local_2850[2];
      uStack_24c8 = local_2850[3];
      local_24c0 = local_24e0;
      uStack_24b8 = uStack_24d8;
      uStack_24b0 = uStack_24d0;
      uStack_24a8 = uStack_24c8;
      local_24a0 = local_24e0;
      uStack_2498 = uStack_24d8;
      uStack_2490 = uStack_24d0;
      uStack_2488 = uStack_24c8;
      local_2480 = local_24e0;
      uStack_2478 = uStack_24d8;
      uStack_2470 = uStack_24d0;
      uStack_2468 = uStack_24c8;
      local_23f8 = local_2e0;
      local_23a8 = local_158;
      for (local_24e4 = 0; local_24e4 < local_2444; local_24e4 = local_24e4 + 1) {
        local_1650 = local_23f8;
        local_2520 = *local_23f8;
        uStack_2518 = local_23f8[1];
        uStack_2510 = local_23f8[2];
        uStack_2508 = local_23f8[3];
        local_1168 = local_23a8;
        local_11a0 = *local_23a8;
        local_2540 = CONCAT44(local_11a0,local_11a0);
        uStack_2538 = CONCAT44(local_11a0,local_11a0);
        uStack_2530 = CONCAT44(local_11a0,local_11a0);
        uStack_2528 = CONCAT44(local_11a0,local_11a0);
        local_11a8 = local_23a8 + 1;
        local_11e0 = *local_11a8;
        local_2560 = CONCAT44(local_11e0,local_11e0);
        uStack_2558 = CONCAT44(local_11e0,local_11e0);
        uStack_2550 = CONCAT44(local_11e0,local_11e0);
        uStack_2548 = CONCAT44(local_11e0,local_11e0);
        local_11e8 = local_23a8 + 2;
        local_1220 = *local_11e8;
        local_2580 = CONCAT44(local_1220,local_1220);
        uStack_2578 = CONCAT44(local_1220,local_1220);
        uStack_2570 = CONCAT44(local_1220,local_1220);
        uStack_2568 = CONCAT44(local_1220,local_1220);
        local_1228 = local_23a8 + 3;
        local_1260 = *local_1228;
        local_25a0 = CONCAT44(local_1260,local_1260);
        uStack_2598 = CONCAT44(local_1260,local_1260);
        uStack_2590 = CONCAT44(local_1260,local_1260);
        uStack_2588 = CONCAT44(local_1260,local_1260);
        local_de0 = local_2480;
        uStack_dd8 = uStack_2478;
        uStack_dd0 = uStack_2470;
        uStack_dc8 = uStack_2468;
        local_540._0_4_ = (float)local_2520;
        local_540._4_4_ = (float)((ulong)local_2520 >> 0x20);
        uStack_538._0_4_ = (float)uStack_2518;
        uStack_538._4_4_ = (float)((ulong)uStack_2518 >> 0x20);
        uStack_530._0_4_ = (float)uStack_2510;
        uStack_530._4_4_ = (float)((ulong)uStack_2510 >> 0x20);
        uStack_528._0_4_ = (float)uStack_2508;
        local_860 = local_11a0 * (float)local_540;
        fStack_85c = local_11a0 * local_540._4_4_;
        fStack_858 = local_11a0 * (float)uStack_538;
        fStack_854 = local_11a0 * uStack_538._4_4_;
        fStack_850 = local_11a0 * (float)uStack_530;
        fStack_84c = local_11a0 * uStack_530._4_4_;
        fStack_848 = local_11a0 * (float)uStack_528;
        uVar1 = local_2480;
        uVar2 = uStack_2478;
        uVar3 = uStack_2470;
        uVar4 = uStack_2468;
        local_880._0_4_ = (float)local_2480;
        local_880._4_4_ = (float)((ulong)local_2480 >> 0x20);
        uStack_878._0_4_ = (float)uStack_2478;
        uStack_878._4_4_ = (float)((ulong)uStack_2478 >> 0x20);
        uStack_870._0_4_ = (float)uStack_2470;
        uStack_870._4_4_ = (float)((ulong)uStack_2470 >> 0x20);
        uStack_868._0_4_ = (float)uStack_2468;
        uStack_868._4_4_ = (float)((ulong)uStack_2468 >> 0x20);
        local_2480 = CONCAT44(fStack_85c + local_880._4_4_,local_860 + (float)local_880);
        uStack_2478 = CONCAT44(fStack_854 + uStack_878._4_4_,fStack_858 + (float)uStack_878);
        uStack_2470 = CONCAT44(fStack_84c + uStack_870._4_4_,fStack_850 + (float)uStack_870);
        uStack_2468 = CONCAT44(local_11a0 + uStack_868._4_4_,fStack_848 + (float)uStack_868);
        local_e40 = local_24a0;
        uStack_e38 = uStack_2498;
        uStack_e30 = uStack_2490;
        uStack_e28 = uStack_2488;
        local_820 = local_11e0 * (float)local_540;
        fStack_81c = local_11e0 * local_540._4_4_;
        fStack_818 = local_11e0 * (float)uStack_538;
        fStack_814 = local_11e0 * uStack_538._4_4_;
        fStack_810 = local_11e0 * (float)uStack_530;
        fStack_80c = local_11e0 * uStack_530._4_4_;
        fStack_808 = local_11e0 * (float)uStack_528;
        uVar5 = local_24a0;
        uVar6 = uStack_2498;
        uVar7 = uStack_2490;
        uVar8 = uStack_2488;
        local_840._0_4_ = (float)local_24a0;
        local_840._4_4_ = (float)((ulong)local_24a0 >> 0x20);
        uStack_838._0_4_ = (float)uStack_2498;
        uStack_838._4_4_ = (float)((ulong)uStack_2498 >> 0x20);
        uStack_830._0_4_ = (float)uStack_2490;
        uStack_830._4_4_ = (float)((ulong)uStack_2490 >> 0x20);
        uStack_828._0_4_ = (float)uStack_2488;
        uStack_828._4_4_ = (float)((ulong)uStack_2488 >> 0x20);
        local_24a0 = CONCAT44(fStack_81c + local_840._4_4_,local_820 + (float)local_840);
        uStack_2498 = CONCAT44(fStack_814 + uStack_838._4_4_,fStack_818 + (float)uStack_838);
        uStack_2490 = CONCAT44(fStack_80c + uStack_830._4_4_,fStack_810 + (float)uStack_830);
        uStack_2488 = CONCAT44(local_11e0 + uStack_828._4_4_,fStack_808 + (float)uStack_828);
        local_ea0 = local_24c0;
        uStack_e98 = uStack_24b8;
        uStack_e90 = uStack_24b0;
        uStack_e88 = uStack_24a8;
        local_7e0 = local_1220 * (float)local_540;
        fStack_7dc = local_1220 * local_540._4_4_;
        fStack_7d8 = local_1220 * (float)uStack_538;
        fStack_7d4 = local_1220 * uStack_538._4_4_;
        fStack_7d0 = local_1220 * (float)uStack_530;
        fStack_7cc = local_1220 * uStack_530._4_4_;
        fStack_7c8 = local_1220 * (float)uStack_528;
        uVar9 = local_24c0;
        uVar10 = uStack_24b8;
        uVar11 = uStack_24b0;
        uVar12 = uStack_24a8;
        local_800._0_4_ = (float)local_24c0;
        local_800._4_4_ = (float)((ulong)local_24c0 >> 0x20);
        uStack_7f8._0_4_ = (float)uStack_24b8;
        uStack_7f8._4_4_ = (float)((ulong)uStack_24b8 >> 0x20);
        uStack_7f0._0_4_ = (float)uStack_24b0;
        uStack_7f0._4_4_ = (float)((ulong)uStack_24b0 >> 0x20);
        uStack_7e8._0_4_ = (float)uStack_24a8;
        uStack_7e8._4_4_ = (float)((ulong)uStack_24a8 >> 0x20);
        local_24c0 = CONCAT44(fStack_7dc + local_800._4_4_,local_7e0 + (float)local_800);
        uStack_24b8 = CONCAT44(fStack_7d4 + uStack_7f8._4_4_,fStack_7d8 + (float)uStack_7f8);
        uStack_24b0 = CONCAT44(fStack_7cc + uStack_7f0._4_4_,fStack_7d0 + (float)uStack_7f0);
        uStack_24a8 = CONCAT44(local_1220 + uStack_7e8._4_4_,fStack_7c8 + (float)uStack_7e8);
        local_f00 = local_24e0;
        uStack_ef8 = uStack_24d8;
        uStack_ef0 = uStack_24d0;
        uStack_ee8 = uStack_24c8;
        local_7a0 = local_1260 * (float)local_540;
        fStack_79c = local_1260 * local_540._4_4_;
        fStack_798 = local_1260 * (float)uStack_538;
        fStack_794 = local_1260 * uStack_538._4_4_;
        fStack_790 = local_1260 * (float)uStack_530;
        fStack_78c = local_1260 * uStack_530._4_4_;
        fStack_788 = local_1260 * (float)uStack_528;
        uVar13 = local_24e0;
        uVar14 = uStack_24d8;
        uVar15 = uStack_24d0;
        uVar16 = uStack_24c8;
        local_7c0._0_4_ = (float)local_24e0;
        local_7c0._4_4_ = (float)((ulong)local_24e0 >> 0x20);
        uStack_7b8._0_4_ = (float)uStack_24d8;
        uStack_7b8._4_4_ = (float)((ulong)uStack_24d8 >> 0x20);
        uStack_7b0._0_4_ = (float)uStack_24d0;
        uStack_7b0._4_4_ = (float)((ulong)uStack_24d0 >> 0x20);
        uStack_7a8._0_4_ = (float)uStack_24c8;
        uStack_7a8._4_4_ = (float)((ulong)uStack_24c8 >> 0x20);
        local_24e0 = CONCAT44(fStack_79c + local_7c0._4_4_,local_7a0 + (float)local_7c0);
        uStack_24d8 = CONCAT44(fStack_794 + uStack_7b8._4_4_,fStack_798 + (float)uStack_7b8);
        uStack_24d0 = CONCAT44(fStack_78c + uStack_7b0._4_4_,fStack_790 + (float)uStack_7b0);
        uStack_24c8 = CONCAT44(local_1260 + uStack_7a8._4_4_,fStack_788 + (float)uStack_7a8);
        local_23a8 = local_23a8 + 4;
        local_23f8 = local_23f8 + 4;
        fStack_125c = local_1260;
        fStack_1258 = local_1260;
        fStack_1254 = local_1260;
        fStack_1250 = local_1260;
        fStack_124c = local_1260;
        fStack_1248 = local_1260;
        fStack_1244 = local_1260;
        local_122c = local_1260;
        fStack_121c = local_1220;
        fStack_1218 = local_1220;
        fStack_1214 = local_1220;
        fStack_1210 = local_1220;
        fStack_120c = local_1220;
        fStack_1208 = local_1220;
        fStack_1204 = local_1220;
        local_11ec = local_1220;
        fStack_11dc = local_11e0;
        fStack_11d8 = local_11e0;
        fStack_11d4 = local_11e0;
        fStack_11d0 = local_11e0;
        fStack_11cc = local_11e0;
        fStack_11c8 = local_11e0;
        fStack_11c4 = local_11e0;
        local_11ac = local_11e0;
        fStack_119c = local_11a0;
        fStack_1198 = local_11a0;
        fStack_1194 = local_11a0;
        fStack_1190 = local_11a0;
        fStack_118c = local_11a0;
        fStack_1188 = local_11a0;
        fStack_1184 = local_11a0;
        local_116c = local_11a0;
        local_ee0 = local_2520;
        uStack_ed8 = uStack_2518;
        uStack_ed0 = uStack_2510;
        uStack_ec8 = uStack_2508;
        local_ec0 = local_25a0;
        uStack_eb8 = uStack_2598;
        uStack_eb0 = uStack_2590;
        uStack_ea8 = uStack_2588;
        local_e80 = local_2520;
        uStack_e78 = uStack_2518;
        uStack_e70 = uStack_2510;
        uStack_e68 = uStack_2508;
        local_e60 = local_2580;
        uStack_e58 = uStack_2578;
        uStack_e50 = uStack_2570;
        uStack_e48 = uStack_2568;
        local_e20 = local_2520;
        uStack_e18 = uStack_2518;
        uStack_e10 = uStack_2510;
        uStack_e08 = uStack_2508;
        local_e00 = local_2560;
        uStack_df8 = uStack_2558;
        uStack_df0 = uStack_2550;
        uStack_de8 = uStack_2548;
        local_dc0 = local_2520;
        uStack_db8 = uStack_2518;
        uStack_db0 = uStack_2510;
        uStack_da8 = uStack_2508;
        local_da0 = local_2540;
        uStack_d98 = uStack_2538;
        uStack_d90 = uStack_2530;
        uStack_d88 = uStack_2528;
        local_880 = uVar1;
        uStack_878 = uVar2;
        uStack_870 = uVar3;
        uStack_868 = uVar4;
        fStack_844 = local_11a0;
        local_840 = uVar5;
        uStack_838 = uVar6;
        uStack_830 = uVar7;
        uStack_828 = uVar8;
        fStack_804 = local_11e0;
        local_800 = uVar9;
        uStack_7f8 = uVar10;
        uStack_7f0 = uVar11;
        uStack_7e8 = uVar12;
        fStack_7c4 = local_1220;
        local_7c0 = uVar13;
        uStack_7b8 = uVar14;
        uStack_7b0 = uVar15;
        uStack_7a8 = uVar16;
        fStack_784 = local_1260;
        local_540 = local_2520;
        uStack_538 = uStack_2518;
        uStack_530 = uStack_2510;
        uStack_528 = uStack_2508;
        local_520 = local_11a0;
        fStack_51c = local_11a0;
        fStack_518 = local_11a0;
        fStack_514 = local_11a0;
        fStack_510 = local_11a0;
        fStack_50c = local_11a0;
        fStack_508 = local_11a0;
        fStack_504 = local_11a0;
        local_500 = local_2520;
        uStack_4f8 = uStack_2518;
        uStack_4f0 = uStack_2510;
        uStack_4e8 = uStack_2508;
        local_4e0 = local_11e0;
        fStack_4dc = local_11e0;
        fStack_4d8 = local_11e0;
        fStack_4d4 = local_11e0;
        fStack_4d0 = local_11e0;
        fStack_4cc = local_11e0;
        fStack_4c8 = local_11e0;
        fStack_4c4 = local_11e0;
        local_4c0 = local_2520;
        uStack_4b8 = uStack_2518;
        uStack_4b0 = uStack_2510;
        uStack_4a8 = uStack_2508;
        local_4a0 = local_1220;
        fStack_49c = local_1220;
        fStack_498 = local_1220;
        fStack_494 = local_1220;
        fStack_490 = local_1220;
        fStack_48c = local_1220;
        fStack_488 = local_1220;
        fStack_484 = local_1220;
        local_480 = local_2520;
        uStack_478 = uStack_2518;
        uStack_470 = uStack_2510;
        uStack_468 = uStack_2508;
        local_460 = local_1260;
        fStack_45c = local_1260;
        fStack_458 = local_1260;
        fStack_454 = local_1260;
        fStack_450 = local_1260;
        fStack_44c = local_1260;
        fStack_448 = local_1260;
        fStack_444 = local_1260;
      }
      local_1508 = local_2030;
      local_1540 = local_2480;
      uStack_1538 = uStack_2478;
      uStack_1530 = uStack_2470;
      uStack_1528 = uStack_2468;
      *(undefined8 *)*local_2030 = local_2480;
      *(undefined8 *)(*local_2030 + 8) = uStack_2478;
      *(undefined8 *)(*local_2030 + 0x10) = uStack_2470;
      *(undefined8 *)(*local_2030 + 0x18) = uStack_2468;
      local_1548 = local_2030 + 1;
      local_1580 = local_24a0;
      uStack_1578 = uStack_2498;
      uStack_1570 = uStack_2490;
      uStack_1568 = uStack_2488;
      *(undefined8 *)*local_1548 = local_24a0;
      *(undefined8 *)(local_2030[1] + 8) = uStack_2498;
      *(undefined8 *)(local_2030[1] + 0x10) = uStack_2490;
      *(undefined8 *)(local_2030[1] + 0x18) = uStack_2488;
      local_1588 = local_2030 + 2;
      local_15c0 = local_24c0;
      uStack_15b8 = uStack_24b8;
      uStack_15b0 = uStack_24b0;
      uStack_15a8 = uStack_24a8;
      *(undefined8 *)*local_1588 = local_24c0;
      *(undefined8 *)(local_2030[2] + 8) = uStack_24b8;
      *(undefined8 *)(local_2030[2] + 0x10) = uStack_24b0;
      *(undefined8 *)(local_2030[2] + 0x18) = uStack_24a8;
      local_15c8 = local_2030 + 3;
      local_1600 = local_24e0;
      uStack_15f8 = uStack_24d8;
      uStack_15f0 = uStack_24d0;
      uStack_15e8 = uStack_24c8;
      auVar34._8_8_ = uStack_24d8;
      auVar34._0_8_ = local_24e0;
      auVar34._16_8_ = uStack_24d0;
      auVar34._24_8_ = uStack_24c8;
      *local_15c8 = auVar34;
      local_2030 = local_2030 + 4;
      local_1bc8 = local_1c80;
      local_1ba8 = local_1c90;
      local_2420 = local_2f8;
    }
    for (; local_20ac < local_1d54; local_20ac = local_20ac + 1) {
      local_1a7c = local_20ac / 8 +
                   (int)((long)((ulong)(uint)((int)((long)local_20ac % 8) >> 0x1f) << 0x20 |
                               (long)local_20ac % 8 & 0xffffffffU) / 4) + local_20ac % 4;
      local_1a70 = &local_25f0;
      local_1a78 = &local_1db0;
      local_120 = (float *)((long)local_1db0 + local_1d70 * local_1a7c * local_1da0);
      local_108 = &local_25f0;
      local_f8 = (long)local_1d84 * (long)local_1d80 * local_1da0;
      local_17b8 = &local_25f0;
      local_1c70 = &local_25f0;
      local_25d0 = local_1d90;
      local_fc = 0x10;
      local_10c = local_1d84;
      local_110 = local_1d80;
      local_114 = local_1d7c;
      local_128 = local_1da0;
      local_12c = local_1d98;
      local_138 = local_1d90;
      local_1a7d = 1;
      local_18c8 = &local_2640;
      local_294 = *(int *)((long)local_1d40 + 0x2c);
      local_298 = (int)local_1d40[6];
      local_29c = *(undefined4 *)((long)local_1d40 + 0x34);
      local_2a8 = (undefined8 *)(*local_1d40 + local_1d40[8] * (long)local_2028 * local_1d40[2]);
      local_2b0 = local_1d40[2];
      local_2b4 = (undefined4)local_1d40[3];
      local_2c0 = local_1d40[4];
      local_290 = &local_2640;
      local_88 = (long)local_294 * (long)local_298 * local_2b0;
      local_25b8 = 0;
      local_25bc = 0;
      local_25c0 = 0;
      local_25c4 = 0;
      local_25d8 = 0;
      local_25e0 = 0;
      local_25e8 = 0;
      local_25f0 = 0;
      local_8c = 0x10;
      local_18d4 = local_2028;
      local_18d5 = 1;
      local_25b0 = 0;
      local_25c8 = 0;
      local_1910 = &local_2640;
      local_1c60 = &local_2640;
      local_2640 = 0;
      local_2630 = 0;
      local_2628 = 0;
      local_2618 = 0;
      local_2614 = 0;
      local_2610 = 0;
      local_260c = 0;
      local_2608 = 0;
      local_2600 = 0;
      local_2638 = 0;
      local_12c0 = local_2850;
      local_2680 = *local_2850;
      uStack_2678 = local_2850[1];
      uStack_2670 = local_2850[2];
      uStack_2668 = local_2850[3];
      local_25f8 = local_2a8;
      local_25a8 = local_120;
      for (local_2684 = 0; local_2684 < local_1d5c * local_1d58; local_2684 = local_2684 + 1) {
        local_1658 = local_25f8;
        uVar1 = *local_25f8;
        uVar2 = local_25f8[1];
        uVar3 = local_25f8[2];
        uVar4 = local_25f8[3];
        local_1268 = local_25a8;
        local_12a0 = *local_25a8;
        local_f40 = CONCAT44(local_12a0,local_12a0);
        uStack_f38 = CONCAT44(local_12a0,local_12a0);
        uStack_f30 = CONCAT44(local_12a0,local_12a0);
        uStack_f28 = CONCAT44(local_12a0,local_12a0);
        local_f60 = local_2680;
        uStack_f58 = uStack_2678;
        uStack_f50 = uStack_2670;
        uStack_f48 = uStack_2668;
        local_f20._0_4_ = (float)uVar1;
        local_420 = (float)local_f20;
        local_f20._4_4_ = (float)((ulong)uVar1 >> 0x20);
        fStack_41c = local_f20._4_4_;
        uStack_f18._0_4_ = (float)uVar2;
        fStack_418 = (float)uStack_f18;
        uStack_f18._4_4_ = (float)((ulong)uVar2 >> 0x20);
        fStack_414 = uStack_f18._4_4_;
        uStack_f10._0_4_ = (float)uVar3;
        fStack_410 = (float)uStack_f10;
        uStack_f10._4_4_ = (float)((ulong)uVar3 >> 0x20);
        fStack_40c = uStack_f10._4_4_;
        uStack_f08._0_4_ = (float)uVar4;
        fStack_408 = (float)uStack_f08;
        uStack_f08._4_4_ = (float)((ulong)uVar4 >> 0x20);
        fStack_744 = uStack_f08._4_4_;
        local_760 = (float)local_f20 * local_12a0;
        fStack_75c = local_f20._4_4_ * local_12a0;
        fStack_758 = (float)uStack_f18 * local_12a0;
        fStack_754 = uStack_f18._4_4_ * local_12a0;
        fStack_750 = (float)uStack_f10 * local_12a0;
        fStack_74c = uStack_f10._4_4_ * local_12a0;
        fStack_748 = (float)uStack_f08 * local_12a0;
        uVar5 = local_2680;
        uVar6 = uStack_2678;
        uVar7 = uStack_2670;
        uVar8 = uStack_2668;
        local_780._0_4_ = (float)local_2680;
        local_780._4_4_ = (float)((ulong)local_2680 >> 0x20);
        uStack_778._0_4_ = (float)uStack_2678;
        uStack_778._4_4_ = (float)((ulong)uStack_2678 >> 0x20);
        uStack_770._0_4_ = (float)uStack_2670;
        uStack_770._4_4_ = (float)((ulong)uStack_2670 >> 0x20);
        uStack_768._0_4_ = (float)uStack_2668;
        uStack_768._4_4_ = (float)((ulong)uStack_2668 >> 0x20);
        local_2680 = CONCAT44(fStack_75c + local_780._4_4_,local_760 + (float)local_780);
        uStack_2678 = CONCAT44(fStack_754 + uStack_778._4_4_,fStack_758 + (float)uStack_778);
        uStack_2670 = CONCAT44(fStack_74c + uStack_770._4_4_,fStack_750 + (float)uStack_770);
        uStack_2668 = CONCAT44(uStack_f08._4_4_ + uStack_768._4_4_,fStack_748 + (float)uStack_768);
        local_25a8 = local_25a8 + 1;
        local_25f8 = local_25f8 + 4;
        fStack_129c = local_12a0;
        fStack_1298 = local_12a0;
        fStack_1294 = local_12a0;
        fStack_1290 = local_12a0;
        fStack_128c = local_12a0;
        fStack_1288 = local_12a0;
        fStack_1284 = local_12a0;
        local_126c = local_12a0;
        local_f20 = uVar1;
        uStack_f18 = uVar2;
        uStack_f10 = uVar3;
        uStack_f08 = uVar4;
        local_780 = uVar5;
        uStack_778 = uVar6;
        uStack_770 = uVar7;
        uStack_768 = uVar8;
        local_440 = local_f40;
        uStack_438 = uStack_f38;
        uStack_430 = uStack_f30;
        uStack_428 = uStack_f28;
        fStack_404 = fStack_744;
      }
      local_1608 = local_2030;
      local_1640 = local_2680;
      uStack_1638 = uStack_2678;
      uStack_1630 = uStack_2670;
      uStack_1628 = uStack_2668;
      auVar33._8_8_ = uStack_2678;
      auVar33._0_8_ = local_2680;
      auVar33._16_8_ = uStack_2670;
      auVar33._24_8_ = uStack_2668;
      *local_2030 = auVar33;
      local_2030 = local_2030 + 1;
      local_1c08 = local_1c60;
      local_1be8 = local_1c70;
      local_2620 = local_2c0;
    }
  }
  local_1c50 = &local_1db0;
  if (local_1da8 != (int *)0x0) {
    local_1c2c = 0xffffffff;
    LOCK();
    local_1c30 = *local_1da8;
    *local_1da8 = *local_1da8 + -1;
    UNLOCK();
    if (local_1c30 == 1) {
      local_1c28 = local_1c50;
      if (local_1d90 == (long *)0x0) {
        local_1668 = local_1db0;
        if (local_1db0 != (void *)0x0) {
          free(local_1db0);
        }
      }
      else {
        (**(code **)(*local_1d90 + 0x18))(local_1d90,local_1db0);
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack1to8_avx(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u, 1, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u, 1, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _r0 = _mm256_loadu_ps(img0);
                    _mm256_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 8;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _r0 = _mm_loadu_ps(img0);
                    _mm_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 4;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    img0 += size;
                    tmpptr += 1;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 8 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;
            __m256 _sum4 = _sum0;
            __m256 _sum5 = _sum0;
            __m256 _sum6 = _sum0;
            __m256 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr0);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                __m256 _val4 = _mm256_broadcast_ss(tmpptr + 4);
                __m256 _val5 = _mm256_broadcast_ss(tmpptr + 5);
                _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                __m256 _val6 = _mm256_broadcast_ss(tmpptr + 6);
                __m256 _val7 = _mm256_broadcast_ss(tmpptr + 7);
                _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr0 += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 8 * 2, _sum2);
            _mm256_store_ps(outptr0 + 8 * 3, _sum3);
            _mm256_store_ps(outptr0 + 8 * 4, _sum4);
            _mm256_store_ps(outptr0 + 8 * 5, _sum5);
            _mm256_store_ps(outptr0 + 8 * 6, _sum6);
            _mm256_store_ps(outptr0 + 8 * 7, _sum7);
            outptr0 += 64;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr0);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);

                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr0 += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 16, _sum2);
            _mm256_store_ps(outptr0 + 24, _sum3);
            outptr0 += 32;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256 _sum = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr0);
                __m256 _val = _mm256_broadcast_ss(tmpptr);
                _sum = _mm256_comp_fmadd_ps(_w0, _val, _sum);

                tmpptr += 1;
                kptr0 += 8;
            }

            _mm256_store_ps(outptr0, _sum);
            outptr0 += 8;
        }
    }
}